

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

void leveldb::PutLengthPrefixedSlice(string *dst,Slice *value)

{
  PutVarint32(dst,(uint32_t)value->size_);
  std::__cxx11::string::append((char *)dst,(ulong)value->data_);
  return;
}

Assistant:

void PutLengthPrefixedSlice(std::string *dst, const Slice &value) {
        PutVarint32(dst, value.size());
        dst->append(value.data(), value.size());
    }